

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

bool __thiscall embree::TokenStream::trySymbols(TokenStream *this,Token *token,ParseLocation *loc)

{
  bool bVar1;
  Token *pTVar2;
  reference pvVar3;
  string *in_RDI;
  size_t i;
  Token *this_00;
  Token *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  TokenStream *in_stack_ffffffffffffff70;
  Token *local_28;
  
  local_28 = (Token *)0x0;
  while( true ) {
    this_00 = local_28;
    pTVar2 = (Token *)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&in_RDI[0x1a]._M_string_length);
    if (pTVar2 <= this_00) {
      return false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_RDI[0x1a]._M_string_length,(size_type)local_28);
    bVar1 = trySymbol(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) break;
    local_28 = (Token *)((long)&local_28->ty + 1);
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&in_RDI[0x1a]._M_string_length,(size_type)local_28);
  pTVar2 = (Token *)&stack0xffffffffffffff70;
  std::__cxx11::string::string((string *)pTVar2,(string *)pvVar3);
  Token::Token(in_stack_ffffffffffffff60,in_RDI,(Type)((ulong)this_00 >> 0x20),
               (ParseLocation *)pTVar2);
  Token::operator=(this_00,pTVar2);
  Token::~Token(this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  return true;
}

Assistant:

bool TokenStream::trySymbols(Token& token, const ParseLocation& loc)
  {
    for (size_t i=0; i<symbols.size(); i++) {
      if (!trySymbol(symbols[i])) continue;
      token = Token(symbols[i],Token::TY_SYMBOL,loc);
      return true;
    }
    return false;
  }